

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

void todense<float,long>(size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,long *Xc_ind,
                        long *Xc_indptr,double *buffer_arr)

{
  ulong *puVar1;
  long lVar2;
  ulong *puVar3;
  ulong *puVar4;
  ulong *puVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong *puVar11;
  long lVar12;
  
  if (buffer_arr + (end - st) + 1 != buffer_arr) {
    memset(buffer_arr,0,(end - st) * 8 + 8);
  }
  lVar12 = Xc_indptr[col_num];
  lVar2 = Xc_indptr[col_num + 1];
  puVar3 = ix_arr + st;
  puVar4 = ix_arr + end + 1;
  uVar6 = (long)puVar4 - (long)puVar3 >> 3;
  puVar5 = puVar3;
  if (0 < (long)uVar6) {
    do {
      uVar7 = uVar6 >> 1;
      uVar8 = ~uVar7 + uVar6;
      uVar6 = uVar7;
      if (puVar5[uVar7] < (ulong)Xc_ind[lVar12]) {
        puVar5 = puVar5 + uVar7 + 1;
        uVar6 = uVar8;
      }
    } while (0 < (long)uVar6);
  }
  if (lVar12 != lVar2 && puVar5 != puVar4) {
    uVar6 = Xc_ind[lVar2 + -1];
    while (uVar7 = *puVar5, uVar7 <= uVar6) {
      puVar1 = (ulong *)(Xc_ind + lVar12);
      uVar8 = *puVar1;
      if (uVar8 == uVar7) {
        *(double *)((long)buffer_arr + ((long)puVar5 - (long)puVar3)) = (double)Xc[lVar12];
        if (puVar5 == ix_arr + end) {
          return;
        }
        if (lVar12 == lVar2 + -1) {
          return;
        }
        puVar11 = puVar1 + 1;
        puVar5 = puVar5 + 1;
        uVar7 = (long)Xc_ind + (lVar2 * 8 - (long)puVar11) >> 3;
        if (0 < (long)uVar7) {
          do {
            uVar9 = uVar7 >> 1;
            uVar8 = ~uVar9 + uVar7;
            uVar7 = uVar9;
            if (puVar11[uVar9] < *puVar5) {
              puVar11 = puVar11 + uVar9 + 1;
              uVar7 = uVar8;
            }
          } while (0 < (long)uVar7);
        }
LAB_002b653c:
        lVar12 = (long)puVar11 - (long)Xc_ind >> 3;
      }
      else {
        if ((long)uVar8 <= (long)uVar7) {
          puVar11 = puVar1 + 1;
          uVar8 = (long)Xc_ind + (lVar2 * 8 - (long)(puVar1 + 1)) >> 3;
          while (0 < (long)uVar8) {
            uVar10 = uVar8 >> 1;
            uVar9 = ~uVar10 + uVar8;
            uVar8 = uVar10;
            if (puVar11[uVar10] < uVar7) {
              puVar11 = puVar11 + uVar10 + 1;
              uVar8 = uVar9;
            }
          }
          goto LAB_002b653c;
        }
        puVar5 = puVar5 + 1;
        uVar7 = (long)puVar4 - (long)puVar5 >> 3;
        while (0 < (long)uVar7) {
          uVar10 = uVar7 >> 1;
          uVar9 = ~uVar10 + uVar7;
          uVar7 = uVar10;
          if (puVar5[uVar10] < uVar8) {
            puVar5 = puVar5 + uVar10 + 1;
            uVar7 = uVar9;
          }
        }
      }
      if (puVar5 == puVar4) {
        return;
      }
      if (lVar12 == lVar2) {
        return;
      }
    }
  }
  return;
}

Assistant:

void todense(const size_t *restrict ix_arr, size_t st, size_t end,
             size_t col_num,
             const real_t *restrict Xc,
             const sparse_ix *restrict Xc_ind,
             const sparse_ix *restrict Xc_indptr,
             double *restrict buffer_arr)
{
    std::fill(buffer_arr, buffer_arr + (end - st + 1), (double)0);

    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = Xc_ind[end_col];
    const size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, Xc_ind[st_col]);

    for (const size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            buffer_arr[row - (ix_arr + st)] = Xc[curr_pos];
            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }
}